

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O2

t_at * __thiscall xemmai::t_code::f_at(t_code *this,void **a_address)

{
  __normal_iterator<const_xemmai::t_code::t_at_address_*,_std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>_>
  _Var1;
  
  _Var1 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<xemmai::t_code::t_at_address_const*,std::vector<xemmai::t_code::t_at_address,std::allocator<xemmai::t_code::t_at_address>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                    ((this->v_ats).
                     super__Vector_base<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->v_ats).
                     super__Vector_base<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->v_ats).
      super__Vector_base<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _Var1._M_current = (t_at_address *)0x0;
  }
  return &(_Var1._M_current)->super_t_at;
}

Assistant:

const t_at* t_code::f_at(void** a_address) const
{
	auto i = std::lower_bound(v_ats.begin(), v_ats.end(), static_cast<size_t>(a_address - v_instructions.data()));
	return i == v_ats.end() ? nullptr : &*i;
}